

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPMS_NV_PUBLIC_Marshal(TPMS_NV_PUBLIC *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  
  UINT32_Marshal(&source->nvIndex,buffer,size);
  UINT16_Marshal(&source->nameAlg,buffer,size);
  UINT32_Marshal((UINT32 *)&source->attributes,buffer,size);
  UVar1 = TPM2B_DIGEST_Marshal(&source->authPolicy,buffer,size);
  UINT16_Marshal(&source->dataSize,buffer,size);
  return UVar1 + 0xc;
}

Assistant:

UINT16
TPMS_NV_PUBLIC_Marshal(TPMS_NV_PUBLIC *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPMI_RH_NV_INDEX_Marshal((TPMI_RH_NV_INDEX *)&(source->nvIndex), buffer, size));
    result = (UINT16)(result + TPMI_ALG_HASH_Marshal((TPMI_ALG_HASH *)&(source->nameAlg), buffer, size));
    result = (UINT16)(result + TPMA_NV_Marshal((TPMA_NV *)&(source->attributes), buffer, size));
    result = (UINT16)(result + TPM2B_DIGEST_Marshal((TPM2B_DIGEST *)&(source->authPolicy), buffer, size));
    result = (UINT16)(result + UINT16_Marshal((UINT16 *)&(source->dataSize), buffer, size));
    return result;
}